

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::stop_encoding(symbol_codec *this,bool support_arith)

{
  bool bVar1;
  undefined3 in_register_00000031;
  
  if (((CONCAT31(in_register_00000031,support_arith) == 0) ||
      (bVar1 = arith_stop_encoding(this), bVar1)) && (bVar1 = assemble_output_buf(this), bVar1)) {
    this->m_mode = cNull;
    return true;
  }
  return false;
}

Assistant:

bool symbol_codec::stop_encoding(bool support_arith)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      if (support_arith)
      {
         if (!arith_stop_encoding())
            return false;
      }

      if (!assemble_output_buf())
         return false;

      m_mode = cNull;
      return true;
   }